

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

int lws_pvo_get_str(void *in,char *name,char **result)

{
  int iVar1;
  
  if (in != (void *)0x0) {
    do {
      iVar1 = strcmp(*(char **)((long)in + 0x10),name);
      if (iVar1 == 0) {
        *result = *(char **)((long)in + 0x18);
        return 0;
      }
      in = *in;
    } while (in != (void *)0x0);
  }
  return 1;
}

Assistant:

int
lws_pvo_get_str(void *in, const char *name, const char **result)
{
	const struct lws_protocol_vhost_options *pv =
		lws_pvo_search((const struct lws_protocol_vhost_options *)in,
				name);

	if (!pv)
		return 1;

	*result = (const char *)pv->value;

	return 0;
}